

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O3

bool __thiscall
dap::Deserializer::deserialize<dap::Source>(Deserializer *this,optional<dap::Source> *opt)

{
  int iVar1;
  TypeInfo *pTVar2;
  Source v;
  vector<dap::any,_std::allocator<dap::any>_> local_168;
  Source local_148;
  
  local_168.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148.adapterData.val.value.value = (void *)0x0;
  local_148.adapterData.val.value.type = (TypeInfo *)0x0;
  local_148.adapterData.val.value.heap = (void *)0x0;
  any::operator=((any *)&local_148,&local_168);
  std::vector<dap::any,_std::allocator<dap::any>_>::~vector(&local_168);
  local_148.name.val._M_dataplus._M_p = (pointer)&local_148.name.val.field_2;
  local_148.adapterData.set = false;
  local_148.checksums.val.super__Vector_base<dap::Checksum,_std::allocator<dap::Checksum>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.checksums.val.super__Vector_base<dap::Checksum,_std::allocator<dap::Checksum>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_148.checksums.val.super__Vector_base<dap::Checksum,_std::allocator<dap::Checksum>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_148.checksums.val.super__Vector_base<dap::Checksum,_std::allocator<dap::Checksum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_148.checksums._17_8_ = 0;
  local_148.name.val._M_string_length = 0;
  local_148.name.val.field_2._M_local_buf[0] = '\0';
  local_148.name.set = false;
  local_148.origin.val._M_dataplus._M_p = (pointer)&local_148.origin.val.field_2;
  local_148.origin.val._M_string_length = 0;
  local_148.origin.val.field_2._M_local_buf[0] = '\0';
  local_148.origin.set = false;
  local_148.path.val._M_dataplus._M_p = (pointer)&local_148.path.val.field_2;
  local_148.path.val._M_string_length = 0;
  local_148.path.val.field_2._M_local_buf[0] = '\0';
  local_148.path.set = false;
  local_148.presentationHint.val._M_dataplus._M_p = (pointer)&local_148.presentationHint.val.field_2
  ;
  local_148.presentationHint.val._M_string_length = 0;
  local_148.presentationHint.val.field_2._M_local_buf[0] = '\0';
  local_148.presentationHint.set = false;
  local_148.sourceReference.val.val = 0;
  local_148.sourceReference.set = false;
  local_148.sources.val.super__Vector_base<dap::Source,_std::allocator<dap::Source>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_148.sources._17_8_ = 0;
  local_148.sources.val.super__Vector_base<dap::Source,_std::allocator<dap::Source>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.sources.val.super__Vector_base<dap::Source,_std::allocator<dap::Source>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_148.sources.val.super__Vector_base<dap::Source,_std::allocator<dap::Source>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  pTVar2 = TypeOf<dap::Source>::type();
  iVar1 = (*pTVar2->_vptr_TypeInfo[8])(pTVar2,this,&local_148);
  if ((char)iVar1 != '\0') {
    any::operator=((any *)opt,(any *)&local_148);
    (opt->val).adapterData.set = local_148.adapterData.set;
    std::vector<dap::Checksum,_std::allocator<dap::Checksum>_>::operator=
              (&(opt->val).checksums.val,&local_148.checksums.val);
    (opt->val).checksums.set = local_148.checksums.set;
    std::__cxx11::string::_M_assign((string *)&(opt->val).name);
    (opt->val).name.set = local_148.name.set;
    std::__cxx11::string::_M_assign((string *)&(opt->val).origin);
    (opt->val).origin.set = local_148.origin.set;
    std::__cxx11::string::_M_assign((string *)&(opt->val).path);
    (opt->val).path.set = local_148.path.set;
    std::__cxx11::string::_M_assign((string *)&(opt->val).presentationHint);
    (opt->val).presentationHint.set = local_148.presentationHint.set;
    (opt->val).sourceReference.val.val = local_148.sourceReference.val.val;
    (opt->val).sourceReference.set = local_148.sourceReference.set;
    std::vector<dap::Source,_std::allocator<dap::Source>_>::operator=
              (&(opt->val).sources.val,&local_148.sources.val);
    (opt->val).sources.set = local_148.sources.set;
    opt->set = true;
  }
  Source::~Source(&local_148);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}